

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall
Parser::tokenizeFile
          (Parser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *data_in,vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *data_out)

{
  char cVar1;
  long lVar2;
  undefined8 *puVar3;
  string *psVar4;
  bool bVar5;
  bool bVar6;
  vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
  *this_00;
  pointer puVar7;
  pointer puVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b;
  _Alloc_hider _Var12;
  string *data;
  int iVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *a;
  pointer pbVar14;
  undefined8 *puVar15;
  string lineBuffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> line;
  allocator local_a5;
  uint local_a4;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
  *local_70;
  pointer local_68;
  pointer local_60;
  char *local_58;
  string local_50;
  
  pbVar14 = (data_in->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_68 = (data_in->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_70 = (vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              *)data_out;
  do {
    this_00 = local_70;
    if (pbVar14 == local_68) {
      puVar3 = *(undefined8 **)(local_70 + 8);
      for (puVar15 = *(undefined8 **)local_70; puVar15 != puVar3; puVar15 = puVar15 + 3) {
        psVar4 = (string *)puVar15[1];
        for (data = (string *)*puVar15; data != psVar4; data = data + 1) {
          processEscapeSequences(this,data);
        }
      }
      return;
    }
    std::__cxx11::string::string((string *)&local_50,(string *)pbVar14);
    fixSpacing(this,&local_50);
    local_98._M_dataplus._M_p = (pointer)0x0;
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity = 0;
    std::
    vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
    ::emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (this_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_98);
    local_60 = pbVar14;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_98);
    lVar2 = *(long *)(this_00 + 8);
    std::__cxx11::string::string((string *)&local_98,"",&local_a5);
    local_a0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(lVar2 + -0x18);
    local_58 = local_50._M_dataplus._M_p + local_50._M_string_length;
    iVar13 = 0;
    iVar11 = 0;
    bVar5 = false;
    bVar6 = false;
    for (_Var12._M_p = local_50._M_dataplus._M_p; _Var12._M_p != local_58;
        _Var12._M_p = _Var12._M_p + 1) {
      puVar7 = (this->seperatorTokens).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar8 = (this->seperatorTokens).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_a4 = 0;
      uVar10 = 0;
      while (iVar9 = (int)uVar10, uVar10 < (ulong)((long)puVar8 - (long)puVar7)) {
        cVar1 = *_Var12._M_p;
        if (cVar1 == ']') {
          iVar11 = iVar11 + -1;
        }
        else if (cVar1 == '(') {
          iVar13 = iVar13 + 1;
LAB_0010afdc:
          bVar5 = true;
        }
        else if (cVar1 == ')') {
          iVar13 = iVar13 + -1;
          if (iVar13 == 0) {
            bVar5 = false;
          }
        }
        else if (cVar1 == '[') {
          iVar11 = iVar11 + 1;
        }
        else if (cVar1 == '\"') {
          bVar6 = (bool)(bVar6 ^ 1);
          goto LAB_0010afdc;
        }
        if ((((bVar6) || ((int)cVar1 != (uint)puVar7[uVar10])) || (bVar5)) || (iVar11 != 0)) {
          if ((bVar5) && (iVar13 == 1 && cVar1 == '(')) {
            if (local_98._M_string_length != 0) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string&>(local_a0,&local_98);
            }
            goto LAB_0010b073;
          }
        }
        else {
          local_a4 = (uint)CONCAT71((int7)((ulong)puVar7 >> 8),1);
          if (local_98._M_string_length != 0) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string&>(local_a0,&local_98);
          }
LAB_0010b073:
          local_98._M_string_length = 0;
          *local_98._M_dataplus._M_p = '\0';
          puVar7 = (this->seperatorTokens).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar8 = (this->seperatorTokens).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          iVar9 = (int)puVar8 - (int)puVar7;
        }
        uVar10 = (ulong)(iVar9 + 1);
      }
      if (((local_a4 & 1) == 0) || (bVar6)) {
        std::__cxx11::string::push_back((char)&local_98);
      }
    }
    if (local_98._M_string_length != 0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>(local_a0,&local_98);
    }
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_50);
    pbVar14 = local_60 + 1;
  } while( true );
}

Assistant:

void Parser::tokenizeFile(const std::vector<std::string>& data_in, std::vector<std::vector<std::string>>& data_out)
{
    for(auto line : data_in) //Iterate through each line
    {
        fixSpacing(line);
        data_out.emplace_back(std::vector<std::string>());
        std::vector<std::string> &currentLine = data_out.back();
        std::string lineBuffer = "";
        bool isQuotationOpen = false;
        bool isBracketOpen = false;
        int squareBracketDepth = 0;
        unsigned int bracketDepth = 0;
        for(const auto &c : line) //Iterate through each character in each line
        {
            bool isSeperator = false;
            for(unsigned int a = 0; a < seperatorTokens.size(); a++) //Check to see if it's a split token
            {
                if(c == '"')
                {
                    isQuotationOpen = !isQuotationOpen;
                    isBracketOpen = true;
                }
                else if(c == '(')
                {
                    bracketDepth++;
                    isBracketOpen = true;
                }
                else if(c == ')')
                {
                    bracketDepth--;
                    if(bracketDepth == 0)
                        isBracketOpen = false;
                }
                else if(c == '[')
                    squareBracketDepth++;
                else if(c == ']')
                    squareBracketDepth--;
                if(!isQuotationOpen && c == seperatorTokens[a] && !isBracketOpen && squareBracketDepth == 0) //If it is, store the buffered word
                {
                    if(!lineBuffer.empty())
                        currentLine.emplace_back(lineBuffer);
                    lineBuffer.clear();
                    isSeperator = true;
                    a = seperatorTokens.size();
                }
                else if(isBracketOpen && c == '(' && bracketDepth == 1)
                {
                    if(!lineBuffer.empty())
                        currentLine.emplace_back(lineBuffer);
                    lineBuffer.clear();
                    a = seperatorTokens.size();
                }
            }
            if(!isSeperator || isQuotationOpen) //If not a separator, add to buffered word
            {
                lineBuffer += c;
            }
        }
        if(!lineBuffer.empty())
            currentLine.emplace_back(lineBuffer);
    }

    //Process escape sequences
    for(auto &a : data_out)
    {
        for(auto &b : a)
        {
            processEscapeSequences(b);
        }
    }
}